

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OrderMoney.cpp
# Opt level: O0

int __thiscall OrderMoney::amount(OrderMoney *this)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  element_type *peVar4;
  runtime_error *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  OrderMoney *local_10;
  OrderMoney *this_local;
  
  local_10 = this;
  peVar4 = std::__shared_ptr_access<const_Money,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<const_Money,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &this->a);
  (*peVar4->_vptr_Money[3])(&local_30);
  peVar4 = std::__shared_ptr_access<const_Money,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<const_Money,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &this->b);
  (*peVar4->_vptr_Money[3])(&local_50);
  bVar1 = std::operator!=(&local_30,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  if (!bVar1) {
    peVar4 = std::__shared_ptr_access<const_Money,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<const_Money,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->a);
    iVar2 = (*peVar4->_vptr_Money[2])();
    peVar4 = std::__shared_ptr_access<const_Money,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<const_Money,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->b);
    iVar3 = (*peVar4->_vptr_Money[2])();
    return iVar2 + iVar3;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"Multicurrency operations without convert");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

int OrderMoney::amount() const
{
	if (a->currency() != b->currency()) {
		throw runtime_error("Multicurrency operations without convert");
	}
	return a->amount() + b->amount();
}